

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O1

btScalar __thiscall btLCP::AiN_times_qN(btLCP *this,int i,btScalar *q)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  int iVar5;
  float fVar6;
  
  pfVar2 = this->m_A[i] + this->m_nC;
  pfVar3 = q + this->m_nC;
  iVar1 = this->m_nN;
  uVar4 = iVar1 - 2;
  fVar6 = 0.0;
  iVar5 = iVar1;
  if (1 < iVar1) {
    do {
      fVar6 = pfVar2[1] * pfVar3[1] + *pfVar2 * *pfVar3 + fVar6;
      pfVar2 = pfVar2 + 2;
      pfVar3 = pfVar3 + 2;
      iVar5 = iVar5 + -2;
    } while (1 < iVar5);
    uVar4 = (iVar1 - (uVar4 & 0xfffffffe)) - 4;
  }
  if (uVar4 == 0xffffffff) {
    return *pfVar2 * *pfVar3 + fVar6;
  }
  return fVar6;
}

Assistant:

btScalar AiN_times_qN (int i, btScalar *q) const { return btLargeDot (BTAROW(i)+m_nC, q+m_nC, m_nN); }